

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O2

IOTHUB_MESSAGE_RESULT IoTHubMessage_SetAsSecurityMessage(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_MESSAGE_RESULT IVar3;
  char *pcVar4;
  
  if (iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_MESSAGE_INVALID_ARG;
    }
    pcVar4 = "Invalid argument (iotHubMessageHandle is NULL)";
    iVar1 = 0x45c;
    IVar3 = IOTHUB_MESSAGE_INVALID_ARG;
  }
  else {
    iVar1 = set_content_encoding(iotHubMessageHandle,"application/json");
    if (iVar1 == 0) {
      iotHubMessageHandle->is_security_message = true;
      return IOTHUB_MESSAGE_OK;
    }
    p_Var2 = xlogging_get_log_function();
    IVar3 = IOTHUB_MESSAGE_ERROR;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_MESSAGE_ERROR;
    }
    pcVar4 = "Failure setting security message content encoding";
    iVar1 = 0x463;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
            ,"IoTHubMessage_SetAsSecurityMessage",iVar1,1,pcVar4);
  return IVar3;
}

Assistant:

IOTHUB_MESSAGE_RESULT IoTHubMessage_SetAsSecurityMessage(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle)
{
    IOTHUB_MESSAGE_RESULT result;
    if (iotHubMessageHandle == NULL)
    {
        LogError("Invalid argument (iotHubMessageHandle is NULL)");
        result = IOTHUB_MESSAGE_INVALID_ARG;
    }
    else
    {
        if (set_content_encoding(iotHubMessageHandle, SECURITY_CLIENT_JSON_ENCODING) != 0)
        {
            LogError("Failure setting security message content encoding");
            result = IOTHUB_MESSAGE_ERROR;
        }
        else
        {
            iotHubMessageHandle->is_security_message = true;
            result = IOTHUB_MESSAGE_OK;
        }
    }
    return result;
}